

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O0

void __thiscall adios2::core::engine::CampaignManager::~CampaignManager(CampaignManager *this)

{
  Campaign *in_RDI;
  
  if ((in_RDI[1].active & 1U) != 0) {
    Close(this);
  }
  std::__cxx11::string::~string((string *)(in_RDI[6].cachepath.field_2._M_local_buf + 8));
  std::ofstream::~ofstream(in_RDI + 2);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
                    *)0xdb4a1d);
  std::__cxx11::string::~string((string *)&in_RDI[1].hostname);
  UserOptions::Campaign::~Campaign(in_RDI);
  return;
}

Assistant:

CampaignManager::~CampaignManager()
{
    if (m_Opened)
    {
        Close();
    }
}